

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.cpp
# Opt level: O2

void __thiscall duckdb::CSVSchema::MergeSchemas(CSVSchema *this,CSVSchema *other,bool null_padding)

{
  LogicalTypeId source;
  LogicalTypeId destination;
  LogicalTypeId destination_00;
  pointer pLVar1;
  bool bVar2;
  ulong __n;
  reference pvVar3;
  reference pvVar4;
  pointer pCVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  pointer pCVar8;
  long lVar9;
  LogicalType *other_00;
  idx_t i;
  ulong __n_00;
  initializer_list<duckdb::LogicalType> __l;
  vector<duckdb::LogicalType,_true> candidates_by_specificity;
  string name;
  undefined1 local_a8 [48];
  LogicalType local_78;
  LogicalType local_60;
  LogicalType type;
  
  LogicalType::LogicalType((LogicalType *)local_a8,BOOLEAN);
  LogicalType::LogicalType((LogicalType *)(local_a8 + 0x18),BIGINT);
  LogicalType::LogicalType(&local_78,DOUBLE);
  LogicalType::LogicalType(&local_60,VARCHAR);
  __l._M_len = 4;
  __l._M_array = (iterator)local_a8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&candidates_by_specificity.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__l,
             (allocator_type *)&name);
  lVar9 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_a8 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  __n_00 = 0;
  do {
    uVar7 = (long)(this->columns).
                  super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->columns).
                  super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    __n = (long)uVar7 / 0x38;
    if ((__n <= __n_00) ||
       ((ulong)(((long)(other->columns).
                       super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                       super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(other->columns).
                      super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                      super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= __n_00)) {
      if (null_padding) {
        pCVar8 = (other->columns).
                 super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                 super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pCVar5 = (other->columns).
                 super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                 super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (uVar7 < (ulong)((long)pCVar5 - (long)pCVar8)) {
          for (; __n < (ulong)(((long)pCVar5 - (long)pCVar8) / 0x38); __n = __n + 1) {
            pvVar3 = vector<duckdb::CSVColumnInfo,_true>::get<true>(&other->columns,__n);
            ::std::__cxx11::string::string((string *)&name,(string *)pvVar3);
            pvVar3 = vector<duckdb::CSVColumnInfo,_true>::get<true>(&other->columns,__n);
            LogicalType::LogicalType(&type,&pvVar3->type);
            CSVColumnInfo::CSVColumnInfo((CSVColumnInfo *)local_a8,&name,&type);
            ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::
            emplace_back<duckdb::CSVColumnInfo>
                      ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)this
                       ,(CSVColumnInfo *)local_a8);
            CSVColumnInfo::~CSVColumnInfo((CSVColumnInfo *)local_a8);
            pmVar6 = ::std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&this->name_idx_map,&name);
            *pmVar6 = __n;
            LogicalType::~LogicalType(&type);
            ::std::__cxx11::string::~string((string *)&name);
            pCVar8 = (other->columns).
                     super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                     super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pCVar5 = (other->columns).
                     super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                     super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&candidates_by_specificity.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      return;
    }
    pvVar3 = vector<duckdb::CSVColumnInfo,_true>::get<true>(&this->columns,__n_00);
    source = (pvVar3->type).id_;
    pvVar3 = vector<duckdb::CSVColumnInfo,_true>::get<true>(&other->columns,__n_00);
    destination = (pvVar3->type).id_;
    pvVar3 = vector<duckdb::CSVColumnInfo,_true>::get<true>(&this->columns,__n_00);
    pvVar4 = vector<duckdb::CSVColumnInfo,_true>::get<true>(&other->columns,__n_00);
    bVar2 = LogicalType::operator!=(&pvVar3->type,&pvVar4->type);
    if (bVar2) {
      bVar2 = CanWeCastIt(source,destination);
      if (bVar2) {
        pvVar4 = vector<duckdb::CSVColumnInfo,_true>::get<true>(&other->columns,__n_00);
        pvVar3 = vector<duckdb::CSVColumnInfo,_true>::get<true>(&this->columns,__n_00);
        other_00 = &pvVar4->type;
LAB_01894380:
        LogicalType::operator=(&pvVar3->type,other_00);
      }
      else {
        bVar2 = CanWeCastIt(destination,source);
        pLVar1 = candidates_by_specificity.
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        other_00 = candidates_by_specificity.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if (!bVar2) {
          for (; other_00 != pLVar1; other_00 = other_00 + 1) {
            destination_00 = other_00->id_;
            bVar2 = CanWeCastIt(source,destination_00);
            if ((bVar2) && (bVar2 = CanWeCastIt(destination,destination_00), bVar2)) {
              pvVar3 = vector<duckdb::CSVColumnInfo,_true>::get<true>(&this->columns,__n_00);
              goto LAB_01894380;
            }
          }
        }
      }
    }
    __n_00 = __n_00 + 1;
  } while( true );
}

Assistant:

void CSVSchema::MergeSchemas(CSVSchema &other, bool null_padding) {
	// TODO: We could also merge names, maybe by giving preference to non-generated names?
	const vector<LogicalType> candidates_by_specificity = {LogicalType::BOOLEAN, LogicalType::BIGINT,
	                                                       LogicalType::DOUBLE, LogicalType::VARCHAR};
	for (idx_t i = 0; i < columns.size() && i < other.columns.size(); i++) {
		auto this_type = columns[i].type.id();
		auto other_type = other.columns[i].type.id();
		if (columns[i].type != other.columns[i].type) {
			if (CanWeCastIt(this_type, other_type)) {
				// If we can cast this to other, this becomes other
				columns[i].type = other.columns[i].type;
			} else if (!CanWeCastIt(other_type, this_type)) {
				// If we can't cast this to other or other to this, we see which parent they can be both cast to
				for (const auto &type : candidates_by_specificity) {
					if (CanWeCastIt(this_type, type.id()) && CanWeCastIt(other_type, type.id())) {
						columns[i].type = type;
						break;
					}
				}
			}
		}
	}

	if (null_padding && other.columns.size() > columns.size()) {
		for (idx_t i = columns.size(); i < other.columns.size(); i++) {
			auto name = other.columns[i].name;
			auto type = other.columns[i].type;
			columns.push_back({name, type});
			name_idx_map[name] = i;
		}
	}
}